

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O2

ecs_entity_t ecs_lookup(ecs_world_t *world,char *name)

{
  _Bool _Var1;
  ecs_entity_t eVar2;
  
  if (name == (char *)0x0) {
    eVar2 = 0;
  }
  else {
    _Var1 = is_number(name);
    if (_Var1) {
      eVar2 = name_to_id(name);
      return eVar2;
    }
    eVar2 = find_as_alias(world,name);
    if (eVar2 == 0) {
      eVar2 = ecs_lookup_child(world,0,name);
      return eVar2;
    }
  }
  return eVar2;
}

Assistant:

ecs_entity_t ecs_lookup(
    ecs_world_t *world,
    const char *name)
{   
    if (!name) {
        return 0;
    }

    if (is_number(name)) {
        return name_to_id(name);
    }

    ecs_entity_t e = find_as_alias(world, name);
    if (e) {
        return e;
    }    
    
    return ecs_lookup_child(world, 0, name);
}